

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::detail::AddArg<int>
               (string *result,const_iterator *it,const_iterator *itend,int *arg)

{
  uint *puVar1;
  char cVar2;
  char *pcVar3;
  char mod;
  long lVar4;
  uint uVar5;
  ostringstream str;
  long local_1c0 [3];
  uint auStack_1a8 [88];
  string local_48 [32];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
  mod = Parse((ostream *)local_1c0,it,itend);
  pcVar3 = it->_M_current;
  if (pcVar3 == itend->_M_current) goto LAB_0010a33d;
  it->_M_current = pcVar3 + 1;
  cVar2 = *pcVar3;
  switch(cVar2) {
  case 'a':
    puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
    *puVar1 = *puVar1 | 0x104;
    goto LAB_0010a32d;
  case 'b':
    puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
    *puVar1 = *puVar1 | 1;
    Write_impl<bool,_int,_true>::f((ostream *)local_1c0,arg);
    break;
  case 'c':
    Write_impl<char,_int,_true>::f((ostream *)local_1c0,arg);
    break;
  case 'd':
  case 'i':
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18)) & 0xffffffb5 | 2;
    WriteInt<int>((ostringstream *)local_1c0,arg,mod);
    break;
  case 'e':
    lVar4 = *(long *)(local_1c0[0] + -0x18);
    uVar5 = *(uint *)((long)auStack_1a8 + lVar4) & 0xfffffefb | 0x100;
    goto LAB_0010a255;
  case 'f':
    lVar4 = *(long *)(local_1c0[0] + -0x18);
    uVar5 = *(uint *)((long)auStack_1a8 + lVar4) & 0xfffffefb | 4;
LAB_0010a255:
    *(uint *)((long)auStack_1a8 + lVar4) = uVar5;
    goto LAB_0010a32d;
  case 'g':
    puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffefb;
LAB_0010a32d:
    WriteFloat<int>((ostringstream *)local_1c0,arg,mod);
    break;
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'v':
  case 'w':
switchD_0010a15e_caseD_68:
    std::operator<<((ostream *)local_1c0,cVar2);
    break;
  case 'o':
    lVar4 = *(long *)(local_1c0[0] + -0x18);
    uVar5 = *(uint *)((long)auStack_1a8 + lVar4) & 0xffffffb5 | 0x40;
    goto LAB_0010a2c9;
  case 's':
    WriteAnyString((ostream *)local_1c0,(ulong)(uint)*arg);
    break;
  case 'u':
    lVar4 = *(long *)(local_1c0[0] + -0x18);
    uVar5 = *(uint *)((long)auStack_1a8 + lVar4) & 0xffffffb5 | 2;
    goto LAB_0010a2c9;
  case 'x':
    lVar4 = *(long *)(local_1c0[0] + -0x18);
    uVar5 = *(uint *)((long)auStack_1a8 + lVar4) & 0xffffffb5 | 8;
LAB_0010a2c9:
    *(uint *)((long)auStack_1a8 + lVar4) = uVar5;
LAB_0010a2cd:
    WriteUnsignedInt<int>((ostringstream *)local_1c0,arg,mod);
    break;
  default:
    if (cVar2 == 'A') {
      puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
      *puVar1 = *puVar1 | 0x104;
LAB_0010a321:
      puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      goto LAB_0010a32d;
    }
    if (cVar2 == 'E') {
      *(uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18)) =
           *(uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18)) & 0xfffffefb | 0x100;
      goto LAB_0010a321;
    }
    if (cVar2 == 'G') {
      puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
      *puVar1 = *puVar1 & 0xfffffefb;
      goto LAB_0010a321;
    }
    if (cVar2 != 'X') goto switchD_0010a15e_caseD_68;
    *(uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18)) =
         *(uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_1a8 + *(long *)(local_1c0[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    goto LAB_0010a2cd;
  }
LAB_0010a33d:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)result);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  return;
}

Assistant:

void AddArg(std::string& result, std::string::const_iterator& it, const std::string::const_iterator& itend, const Value& arg)
{
	std::ostringstream str;
	try
	{
		char mod = 0;
		mod = Parse(str, it, itend);
		if (it != itend)
		{
			char type = *it++;
			switch (type)
			{
			case 'd':
			case 'i':
				str << std::dec;
				WriteInt(str, arg, mod);
				break;
			case 'u':
				str << std::dec;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'o':
				str << std::oct;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'x':
				str << std::hex;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'X':
				str << std::hex << std::uppercase;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'f':
				str << std::fixed;
				WriteFloat(str, arg, mod);
				break;
			case 'e':
				str << std::scientific;
				WriteFloat(str, arg, mod);
				break;
			case 'E':
				str << std::scientific << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 'g':
				str << std::defaultfloat;
				WriteFloat(str, arg, mod);
				break;
			case 'G':
				str << std::defaultfloat << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 'a':
				str << std::hexfloat;
				WriteFloat(str, arg, mod);
				break;
			case 'A':
				str << std::hexfloat << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 's':
				WriteAnyString(str, arg);
				break;
			case 'c':
				Write<char>(str, arg);
				break;
			case 'b':
				str << std::boolalpha;
				Write<bool>(str, arg);
				break;
			default:
				str << type;
			}
		}
	}
	catch (const std::exception&)
	{
		str << "!TYPE_MISMATCH!";
	}
	result += str.str();
}